

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# managed_buffer.cpp
# Opt level: O2

string * __thiscall
polyscope::typeName_abi_cxx11_
          (string *__return_storage_ptr__,polyscope *this,ManagedBufferType type)

{
  char *pcVar1;
  allocator local_31;
  string local_30;
  
  switch((ulong)this & 0xffffffff) {
  case 0:
    pcVar1 = "Float";
    break;
  case 1:
    pcVar1 = "Double";
    break;
  case 2:
    pcVar1 = "Vec2";
    break;
  case 3:
    pcVar1 = "Vec3";
    break;
  case 4:
    pcVar1 = "Vec4";
    break;
  case 5:
    pcVar1 = "Arr2Vec3";
    break;
  case 6:
    pcVar1 = "Arr3Vec3";
    break;
  case 7:
    pcVar1 = "Arr4Vec3";
    break;
  case 8:
    pcVar1 = "UInt32";
    break;
  case 9:
    pcVar1 = "Int32";
    break;
  case 10:
    pcVar1 = "UVec2";
    break;
  case 0xb:
    pcVar1 = "UVec3";
    break;
  case 0xc:
    pcVar1 = "UVec4";
    break;
  default:
    std::__cxx11::string::string((string *)&local_30,"bad enum",&local_31);
    exception(&local_30);
    std::__cxx11::string::~string((string *)&local_30);
    pcVar1 = (char *)0x0;
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar1,&local_31);
  return __return_storage_ptr__;
}

Assistant:

std::string typeName(ManagedBufferType type) {
  switch (type) {
  // clang-format off
    case ManagedBufferType::Float     : return "Float";    
    case ManagedBufferType::Double    : return "Double";   
    case ManagedBufferType::Vec2      : return "Vec2";     
    case ManagedBufferType::Vec3      : return "Vec3";     
    case ManagedBufferType::Vec4      : return "Vec4";     
    case ManagedBufferType::Arr2Vec3  : return "Arr2Vec3"; 
    case ManagedBufferType::Arr3Vec3  : return "Arr3Vec3"; 
    case ManagedBufferType::Arr4Vec3  : return "Arr4Vec3"; 
    case ManagedBufferType::UInt32    : return "UInt32";   
    case ManagedBufferType::Int32     : return "Int32";    
    case ManagedBufferType::UVec2     : return "UVec2";    
    case ManagedBufferType::UVec3     : return "UVec3";    
    case ManagedBufferType::UVec4     : return "UVec4";
    // clang-format on
  }
  exception("bad enum");
  return 0;
}